

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v7::print<char[10],double&,double&,char>
               (basic_ostream<char,_std::char_traits<char>_> *os,char (*format_str) [10],
               double *args,double *args_1)

{
  remove_reference_t<double_&> *in_R8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_double,_double>
  local_88;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_60;
  basic_string_view<char> local_50;
  remove_reference_t<double_&> *local_40;
  double *args_local_1;
  double *args_local;
  char (*format_str_local) [10];
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  basic_ostream<char,_std::char_traits<char>_> *local_10;
  
  local_40 = args_1;
  args_local_1 = args;
  args_local = (double *)format_str;
  format_str_local = (char (*) [10])os;
  local_50 = to_string_view<char,_0>(*format_str);
  make_args_checked<double&,double&,char[10],char>
            (&local_88,(v7 *)args_local,(char (*) [10])args_local_1,local_40,in_R8);
  local_18 = &local_60;
  os_local = (basic_ostream<char,_std::char_traits<char>_> *)&local_88;
  local_10 = os_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_18,0xaa,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)os_local);
  vprint<char>(os,local_50,local_60);
  return;
}

Assistant:

void print(std::basic_ostream<Char>& os, const S& format_str, Args&&... args) {
  vprint(os, to_string_view(format_str),
         fmt::make_args_checked<Args...>(format_str, args...));
}